

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int is_undirected_automorphism(saucy *s)

{
  Abc_Ntk_t *pNtk1;
  int *piVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pMiter;
  int *__ptr;
  Abc_Ntk_t *pNtk;
  sim_result *psVar4;
  undefined8 *__ptr_00;
  Vec_Ptr_t *pVVar5;
  char *__s;
  ulong uVar6;
  int i;
  long lVar7;
  double dVar8;
  
  lVar7 = 0;
  while (lVar7 < s->ndiffs) {
    iVar2 = check_mapping(s,s->adj,s->edg,s->unsupp[lVar7]);
    lVar7 = lVar7 + 1;
    if (iVar2 == 0) {
      return 0;
    }
  }
  pNtk1 = s->pNtk;
  piVar1 = s->pModel;
  pMiter = Abc_NtkMiter(pNtk1,s->pNtk_permuted,1,0,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    __s = "Miter computation has failed.";
    goto LAB_0027e44f;
  }
  iVar2 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar2 != 1) {
    if (iVar2 == 0) {
      __ptr = Abc_NtkVerifyGetCleanModel(pMiter,1);
      pMiter->pModel = __ptr;
      pVVar5 = pNtk1->vPis;
      for (lVar7 = 0; lVar7 < pVVar5->nSize; lVar7 = lVar7 + 1) {
        piVar1[lVar7] = __ptr[lVar7];
      }
      iVar2 = 0;
      pNtk = pMiter;
      if (__ptr == (int *)0x0) goto LAB_0027e2b5;
    }
    else {
      pNtk = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
      Abc_NtkDelete(pMiter);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        __s = "Renoding for CNF has failed.";
LAB_0027e44f:
        puts(__s);
        exit(1);
      }
      iVar2 = Abc_NtkMiterSat(pNtk,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      if (iVar2 == -1) {
        __s = "Networks are undecided (SAT solver timed out).";
        goto LAB_0027e44f;
      }
      __ptr = pNtk->pModel;
      pMiter = pNtk;
      if (__ptr == (int *)0x0) goto LAB_0027e2b5;
      pVVar5 = pNtk1->vPis;
      for (lVar7 = 0; lVar7 < pVVar5->nSize; lVar7 = lVar7 + 1) {
        piVar1[lVar7] = __ptr[lVar7];
      }
    }
    free(__ptr);
    pNtk->pModel = (int *)0x0;
    pMiter = pNtk;
  }
LAB_0027e2b5:
  Abc_NtkDelete(pMiter);
  if (iVar2 != 0) {
    return iVar2;
  }
  psVar4 = analyzeConflict(s->pNtk,s->pModel,s->fPrintTree);
  add_conterexample(s,psVar4);
  psVar4 = analyzeConflict(s->pNtk_permuted,s->pModel,s->fPrintTree);
  add_conterexample(s,psVar4);
  dVar8 = s->activityInc * 1.1111111111111112;
  s->activityInc = dVar8;
  pVVar5 = s->satCounterExamples;
  iVar2 = pVVar5->nSize;
  if (iVar2 < 0x32) {
    return 0;
  }
  dVar8 = dVar8 / (double)iVar2;
  do {
    if (iVar2 < 0x24) {
      return 0;
    }
    uVar6 = 0;
    iVar3 = iVar2;
    for (i = 0; iVar2 = (int)uVar6, i < iVar3; i = i + 1) {
      __ptr_00 = (undefined8 *)Vec_PtrEntry(pVVar5,i);
      if (dVar8 < (double)__ptr_00[3] || dVar8 == (double)__ptr_00[3]) {
        if (iVar2 < i) {
          if ((iVar2 < 0) || (s->satCounterExamples->nSize <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          s->satCounterExamples->pArray[uVar6] = __ptr_00;
          uVar6 = (ulong)(iVar2 + 1);
        }
      }
      else {
        if ((void *)*__ptr_00 != (void *)0x0) {
          free((void *)*__ptr_00);
          *__ptr_00 = 0;
        }
        free((void *)__ptr_00[1]);
        free(__ptr_00);
      }
      pVVar5 = s->satCounterExamples;
      iVar3 = pVVar5->nSize;
    }
    if (iVar3 < iVar2) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    pVVar5->nSize = iVar2;
    dVar8 = dVar8 + dVar8;
  } while( true );
}

Assistant:

static int
is_undirected_automorphism(struct saucy *s)
{
    int i, j, ret;  

    for (i = 0; i < s->ndiffs; ++i) {
        j = s->unsupp[i];
        if (!check_mapping(s, s->adj, s->edg, j)) return 0;
    }

    ret = Abc_NtkCecSat_saucy(s->pNtk, s->pNtk_permuted, s->pModel);
    
    if( BACKTRACK_BY_SAT && !ret ) {
        struct sim_result * cex;

        cex = analyzeConflict( s->pNtk, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);

        cex = analyzeConflict( s->pNtk_permuted, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);      
        
        s->activityInc *= (1 / CLAUSE_DECAY);
        if (Vec_PtrSize(s->satCounterExamples) >= MAX_LEARNTS)
            reduceDB(s);
    }

    return ret;
}